

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANSIFontWriter.cpp
# Opt level: O0

void __thiscall ANSIFontWriter::WriteWidths(ANSIFontWriter *this,DictionaryContext *inFontContext)

{
  ObjectsContext *this_00;
  FreeTypeFaceWrapper *this_01;
  pointer ppVar1;
  reference pvVar2;
  FT_Pos inIntegerToken;
  ushort local_2a;
  iterator iStack_28;
  unsigned_short i;
  iterator itCharacters;
  DictionaryContext *inFontContext_local;
  ANSIFontWriter *this_local;
  
  DictionaryContext::WriteKey(inFontContext,&scFirstChar_abi_cxx11_);
  itCharacters = std::
                 vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
                 ::begin(&this->mCharactersVector);
  ppVar1 = __gnu_cxx::
           __normal_iterator<std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
           ::operator->(&itCharacters);
  DictionaryContext::WriteIntegerValue(inFontContext,(ulong)(ppVar1->second).mEncodedCharacter);
  DictionaryContext::WriteKey(inFontContext,&scLastChar_abi_cxx11_);
  pvVar2 = std::
           vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
           ::back(&this->mCharactersVector);
  DictionaryContext::WriteIntegerValue(inFontContext,(ulong)(pvVar2->second).mEncodedCharacter);
  DictionaryContext::WriteKey(inFontContext,&scWidths_abi_cxx11_);
  ObjectsContext::StartArray(this->mObjectsContext);
  iStack_28 = std::
              vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
              ::begin(&this->mCharactersVector);
  ppVar1 = __gnu_cxx::
           __normal_iterator<std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
           ::operator->(&stack0xffffffffffffffd8);
  local_2a = (ppVar1->second).mEncodedCharacter;
  while( true ) {
    pvVar2 = std::
             vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
             ::back(&this->mCharactersVector);
    if ((pvVar2->second).mEncodedCharacter < local_2a) break;
    ppVar1 = __gnu_cxx::
             __normal_iterator<std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
             ::operator->(&stack0xffffffffffffffd8);
    if ((ppVar1->second).mEncodedCharacter == local_2a) {
      this_00 = this->mObjectsContext;
      this_01 = this->mFontInfo;
      ppVar1 = __gnu_cxx::
               __normal_iterator<std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
               ::operator->(&stack0xffffffffffffffd8);
      inIntegerToken = FreeTypeFaceWrapper::GetGlyphWidth(this_01,ppVar1->first);
      ObjectsContext::WriteInteger(this_00,inIntegerToken,eTokenSeparatorSpace);
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
      ::operator++(&stack0xffffffffffffffd8);
    }
    else {
      ObjectsContext::WriteInteger(this->mObjectsContext,0,eTokenSeparatorSpace);
    }
    local_2a = local_2a + 1;
  }
  ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorNone);
  ObjectsContext::EndLine(this->mObjectsContext);
  return;
}

Assistant:

void ANSIFontWriter::WriteWidths(DictionaryContext* inFontContext)
{

	// FirstChar
	inFontContext->WriteKey(scFirstChar);
	inFontContext->WriteIntegerValue((mCharactersVector.begin())->second.mEncodedCharacter);
	
    // LastChar
	inFontContext->WriteKey(scLastChar);
	inFontContext->WriteIntegerValue(mCharactersVector.back().second.mEncodedCharacter);

	// Widths
	inFontContext->WriteKey(scWidths);

	mObjectsContext->StartArray();
	
	UIntAndGlyphEncodingInfoVector::iterator itCharacters = mCharactersVector.begin();
	for(unsigned short i = itCharacters->second.mEncodedCharacter; i <= mCharactersVector.back().second.mEncodedCharacter; ++i)
	{
		if(itCharacters->second.mEncodedCharacter == i)
		{
			mObjectsContext->WriteInteger(mFontInfo->GetGlyphWidth(itCharacters->first));
			++itCharacters;
		}
		else
		{
			mObjectsContext->WriteInteger(0);
		}
	}
	mObjectsContext->EndArray();
	mObjectsContext->EndLine();

}